

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O3

string * __thiscall
Assimp::Ogre::OgreXmlSerializer::SkipCurrentNode_abi_cxx11_(OgreXmlSerializer *this)

{
  long *plVar1;
  int iVar2;
  undefined4 extraout_var;
  string *psVar3;
  bool bVar4;
  allocator<char> local_51;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  iVar2 = (*this->m_reader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar2 != '\0') {
    do {
      iVar2 = (*this->m_reader->_vptr_IIrrXMLReader[3])();
      if (iVar2 == 2) {
        iVar2 = (*this->m_reader->_vptr_IIrrXMLReader[0xd])();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,(char *)CONCAT44(extraout_var,iVar2),&local_51);
        plVar1 = local_50;
        if (local_48 == (this->m_currentNodeName)._M_string_length) {
          if (local_48 == 0) {
            bVar4 = true;
          }
          else {
            iVar2 = bcmp(local_50,(this->m_currentNodeName)._M_dataplus._M_p,local_48);
            bVar4 = iVar2 == 0;
          }
        }
        else {
          bVar4 = false;
        }
        if (plVar1 != local_40) {
          operator_delete(plVar1,local_40[0] + 1);
        }
        if (bVar4) {
          psVar3 = NextNode_abi_cxx11_(this);
          return psVar3;
        }
      }
      iVar2 = (*this->m_reader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar2 != '\0');
  }
  std::__cxx11::string::_M_replace
            ((ulong)&this->m_currentNodeName,0,(char *)(this->m_currentNodeName)._M_string_length,
             0x68cee4);
  return &this->m_currentNodeName;
}

Assistant:

std::string &OgreXmlSerializer::SkipCurrentNode()
{
#if (OGRE_XML_SERIALIZER_DEBUG == 1)
    ASSIMP_LOG_DEBUG("Skipping node <" + m_currentNodeName + ">");
#endif

    for(;;) {
        if (!m_reader->read()) {
            m_currentNodeName = "";
            return m_currentNodeName;
        }
        if ( m_reader->getNodeType() != irr::io::EXN_ELEMENT_END ) {
            continue;
        } else if ( std::string( m_reader->getNodeName() ) == m_currentNodeName ) {
            break;
        }
    }

    return NextNode();
}